

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd63_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  int *piVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int kk;
  ulong uVar13;
  float fVar14;
  float fVar15;
  int TILE_K;
  int TILE_M;
  Mat m;
  int TILE_N;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  Mat local_168;
  Mat local_118;
  undefined8 uStack_d0;
  undefined1 local_c8 [12];
  float afStack_bc [3];
  float local_b0 [2];
  undefined8 local_a8;
  undefined8 local_a0;
  float afStack_98 [4];
  size_t local_88;
  float afStack_80 [8];
  ulong local_60;
  ulong local_58;
  Mat *local_50;
  ulong local_48;
  Mat *local_40;
  int local_34;
  
  uVar12 = (ulong)(uint)inch;
  local_50 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_17c,&local_34,(int *)&local_180,opt->num_threads);
  uVar4 = local_180;
  uVar11 = (int)(outch + local_17c + -1) / (int)local_17c;
  iVar7 = local_17c * local_180;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  local_60 = (ulong)(uint)outch;
  Mat::create(&local_168,iVar7 * 0x40,1,opt->num_threads,4,(Allocator *)0x0);
  local_40 = AT;
  Mat::create(AT,iVar7,0x40,(int)(inch + uVar4 + -1) / (int)uVar4,uVar11,4,(Allocator *)0x0);
  if (0 < (int)uVar11) {
    uVar13 = 0;
    local_178 = uVar11;
    local_48 = uVar12;
    do {
      iVar8 = local_17c * (int)uVar13;
      local_58 = uVar13;
      iVar7 = get_omp_thread_num();
      uVar13 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      local_118.data = (void *)((long)iVar7 * local_168.cstep * uVar13 + (long)local_168.data);
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = (undefined4)local_168.elemsize;
      local_118.elemsize._4_4_ = local_168.elemsize._4_4_;
      local_118.elempack = local_168.elempack;
      local_118.allocator = local_168.allocator;
      local_118.d = 1;
      local_118.h = local_168.h;
      local_118.c = local_168.d;
      local_118.w = local_168.w;
      local_118.dims = local_168.dims + -1;
      local_118.cstep =
           (uVar13 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0) / uVar13;
      if (local_168.dims == 4) {
        local_118.cstep = (long)local_168.h * (long)local_168.w;
      }
      if (0 < (int)uVar12) {
        local_174 = (int)local_60 - iVar8;
        iVar7 = 0;
        do {
          local_170 = local_17c;
          uVar4 = local_174;
          if ((int)local_17c < (int)local_174) {
            uVar4 = local_17c;
          }
          uVar11 = (int)uVar12 - iVar7;
          local_16c = local_180;
          if ((int)local_180 < (int)uVar11) {
            uVar11 = local_180;
          }
          if (0 < (int)uVar4) {
            pvVar2 = local_50->data;
            uVar12 = 0;
            pfVar6 = (float *)local_118.data;
            do {
              if (0 < (int)uVar11) {
                uVar13 = 0;
                do {
                  pfVar9 = (float *)((long)pvVar2 +
                                    (uVar13 + (long)iVar7) * 0x24 +
                                    (long)(((int)uVar12 + iVar8) * inch * 9) * 4);
                  lVar10 = 0;
                  do {
                    fVar1 = *pfVar9;
                    fVar14 = pfVar9[1];
                    fVar15 = pfVar9[2];
                    *(float *)(local_c8 + lVar10 * 4) = fVar1;
                    afStack_bc[lVar10] =
                         (fVar1 * -0.22222222 - fVar14 * 0.22222222) + fVar15 * -0.22222222;
                    afStack_bc[lVar10 + 3] =
                         fVar15 * -0.22222222 + fVar1 * -0.22222222 + fVar14 * 0.22222222;
                    *(float *)((long)&local_a8 + lVar10 * 4 + 4) =
                         fVar14 * 0.022222223 + fVar1 * 0.011111111 + fVar15 * 0.044444446;
                    afStack_98[lVar10] =
                         (fVar1 * 0.011111111 - fVar14 * 0.022222223) + fVar15 * 0.044444446;
                    afStack_98[lVar10 + 3] =
                         fVar14 * 0.011111111 + fVar1 * 0.022222223 + fVar15 * 0.0055555557;
                    afStack_80[lVar10] =
                         (fVar1 * 0.022222223 - fVar14 * 0.011111111) + fVar15 * 0.0055555557;
                    afStack_80[lVar10 + 3] = fVar15;
                    pfVar9 = pfVar9 + 3;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar10 = 8;
                  do {
                    fVar1 = *(float *)(local_c8 + lVar10);
                    fVar14 = (float)*(undefined8 *)((long)&uStack_d0 + lVar10);
                    fVar15 = (float)((ulong)*(undefined8 *)((long)&uStack_d0 + lVar10) >> 0x20);
                    *pfVar6 = fVar14;
                    pfVar6[1] = (fVar14 * -0.22222222 - fVar15 * 0.22222222) + fVar1 * -0.22222222;
                    pfVar6[2] = fVar14 * -0.22222222 + fVar15 * 0.22222222 + fVar1 * -0.22222222;
                    pfVar6[3] = fVar14 * 0.011111111 + fVar15 * 0.022222223 + fVar1 * 0.044444446;
                    pfVar6[4] = (fVar14 * 0.011111111 - fVar15 * 0.022222223) + fVar1 * 0.044444446;
                    pfVar6[5] = fVar14 * 0.022222223 + fVar1 * 0.0055555557 + fVar15 * 0.011111111;
                    pfVar6[6] = (fVar14 * 0.022222223 - fVar15 * 0.011111111) + fVar1 * 0.0055555557
                    ;
                    pfVar6[7] = fVar1;
                    pfVar6 = pfVar6 + 8;
                    lVar10 = lVar10 + 0xc;
                  } while (lVar10 != 0x68);
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar11);
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar4);
          }
          sVar3 = local_40->elemsize;
          afStack_98[0] = (float)local_40->h;
          local_b0[0] = (float)local_40->elempack;
          local_a8 = local_40->allocator;
          local_88 = (long)(int)afStack_98[0] * (long)local_40->w;
          local_c8._0_8_ =
               (long)local_40->data +
               sVar3 * local_88 * (long)(iVar7 / (int)local_180) +
               (long)(iVar8 / (int)local_17c) * local_40->cstep * sVar3;
          local_c8._8_4_ = 0;
          afStack_bc[0] = 0.0;
          afStack_bc[1] = (float)sVar3;
          afStack_bc[2] = (float)(sVar3 >> 0x20);
          local_a0._4_4_ = local_40->w;
          local_a0._0_4_ = 2;
          afStack_98[1] = 1.4013e-45;
          afStack_98[2] = 1.4013e-45;
          pack_A_tile(&local_118,(Mat *)local_c8,0x40,uVar4,uVar11);
          uVar12 = local_48;
          piVar5 = (int *)CONCAT44(afStack_bc[0],local_c8._8_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_a8 == (Allocator *)0x0) {
                if ((void *)local_c8._0_8_ != (void *)0x0) {
                  free((void *)local_c8._0_8_);
                }
              }
              else {
                (*local_a8->_vptr_Allocator[3])();
              }
            }
          }
          local_88 = 0;
          local_c8._0_8_ = (void *)0x0;
          local_c8._8_4_ = 0;
          afStack_bc[0] = 0.0;
          afStack_bc[1] = 0.0;
          afStack_bc[2] = 0.0;
          local_b0[0] = 0.0;
          local_a0._0_4_ = 0;
          local_a0._4_4_ = 0;
          afStack_98[0] = 0.0;
          afStack_98[1] = 0.0;
          afStack_98[2] = 0.0;
          iVar7 = iVar7 + local_180;
        } while (iVar7 < (int)uVar12);
      }
      uVar4 = local_178;
      piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if ((float *)local_118.data != (float *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      uVar11 = (int)local_58 + 1;
      uVar13 = (ulong)uVar11;
    } while (uVar11 != uVar4);
  }
  piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 64;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd63_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}